

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  string *psVar4;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,one) == 0) {
    cVar3 = GetDefinitionIfUnquoted(this,arg);
    if (cVar3.Value == (string *)0x0) {
      psVar4 = cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
      iVar2 = atoi((psVar4->_M_dataplus)._M_p);
      if (iVar2 != 0) {
        cmExpandedCommandArgument::GetValue_abi_cxx11_(arg);
      }
    }
  }
  else {
    bVar1 = cmExpandedCommandArgument::operator==(arg,"0");
    if (bVar1) {
      return false;
    }
    bVar1 = cmExpandedCommandArgument::operator==(arg,"1");
    if (bVar1) {
      return true;
    }
    GetDefinitionIfUnquoted(this,arg);
  }
  bVar1 = cmIsOff((cmValue)0x3a87b5);
  return !bVar1;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool const one) const
{
  if (one) {
    // Old IsTrue behavior for single argument.
    if (arg == "0") {
      return false;
    }
    if (arg == "1") {
      return true;
    }
    cmValue def = this->GetDefinitionIfUnquoted(arg);
    return !cmIsOff(def);
  }
  // Old GetVariableOrNumber behavior.
  cmValue def = this->GetDefinitionIfUnquoted(arg);
  if (!def && std::atoi(arg.GetValue().c_str())) {
    def = cmValue(arg.GetValue());
  }
  return !cmIsOff(def);
}